

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O1

void __thiscall QWidgetResizeHandler::setMouseCursor(QWidgetResizeHandler *this,MousePosition m)

{
  long lVar1;
  QArrayData *pQVar2;
  long lVar3;
  bool bVar4;
  CursorShape CVar5;
  QWidget *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  QCursor local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(*(long *)(this + 0x10) + 8);
  pQVar2 = *(QArrayData **)(lVar1 + 0x18);
  lVar3 = *(long *)(lVar1 + 0x20);
  lVar1 = *(long *)(lVar1 + 0x28);
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar1 != 0) {
    lVar7 = 0;
    do {
      pQVar6 = *(QWidget **)(lVar3 + lVar7 * 8);
      if ((pQVar6 == (QWidget *)0x0) || ((*(byte *)(*(long *)&pQVar6->field_0x8 + 0x30) & 1) == 0))
      {
        pQVar6 = (QWidget *)0x0;
      }
      if ((pQVar6 != (QWidget *)0x0) &&
         (bVar4 = QWidget::testAttribute_helper(pQVar6,WA_SetCursor), !bVar4)) {
        QCursor::QCursor(&local_40,ArrowCursor);
        QWidget::setCursor(pQVar6,&local_40);
        QCursor::~QCursor(&local_40);
      }
      lVar7 = lVar7 + 1;
    } while (lVar1 != lVar7);
  }
  switch(m) {
  case TopLeft:
  case BottomRight:
    pQVar6 = *(QWidget **)(this + 0x10);
    CVar5 = SizeFDiagCursor;
    break;
  case BottomLeft:
  case TopRight:
    pQVar6 = *(QWidget **)(this + 0x10);
    CVar5 = SizeBDiagCursor;
    break;
  case Top:
  case Bottom:
    pQVar6 = *(QWidget **)(this + 0x10);
    CVar5 = SizeVerCursor;
    break;
  case Left:
  case Right:
    pQVar6 = *(QWidget **)(this + 0x10);
    CVar5 = SizeHorCursor;
    break;
  default:
    pQVar6 = *(QWidget **)(this + 0x10);
    QCursor::QCursor(&local_40,ArrowCursor);
    QWidget::setCursor(pQVar6,&local_40);
    QCursor::~QCursor(&local_40);
    goto LAB_00475101;
  }
  QCursor::QCursor(&local_40,CVar5);
  QWidget::setCursor(pQVar6,&local_40);
  QCursor::~QCursor(&local_40);
LAB_00475101:
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::setMouseCursor(MousePosition m)
{
#ifdef QT_NO_CURSOR
    Q_UNUSED(m);
#else
    QObjectList children = widget->children();
    for (int i = 0; i < children.size(); ++i) {
        if (QWidget *w = qobject_cast<QWidget*>(children.at(i))) {
            if (!w->testAttribute(Qt::WA_SetCursor)) {
                w->setCursor(Qt::ArrowCursor);
            }
        }
    }

    switch (m) {
    case TopLeft:
    case BottomRight:
        widget->setCursor(Qt::SizeFDiagCursor);
        break;
    case BottomLeft:
    case TopRight:
        widget->setCursor(Qt::SizeBDiagCursor);
        break;
    case Top:
    case Bottom:
        widget->setCursor(Qt::SizeVerCursor);
        break;
    case Left:
    case Right:
        widget->setCursor(Qt::SizeHorCursor);
        break;
    default:
        widget->setCursor(Qt::ArrowCursor);
        break;
    }
#endif // QT_NO_CURSOR
}